

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter.c
# Opt level: O2

int archive_write_add_filter(archive *a,int code)

{
  long lVar1;
  int iVar2;
  long lVar3;
  
  lVar1 = 0;
  do {
    lVar3 = lVar1;
    if (lVar3 + 0x10 == 0xc0) {
      archive_set_error(a,0x16,"No such filter");
      return -0x1e;
    }
    lVar1 = lVar3 + 0x10;
  } while (*(int *)((long)&codes[0].code + lVar3) != code);
  iVar2 = (**(code **)((long)&codes[0].setter + lVar3))();
  return iVar2;
}

Assistant:

int
archive_write_add_filter(struct archive *a, int code)
{
	int i;

	for (i = 0; codes[i].code != -1; i++) {
		if (code == codes[i].code)
			return ((codes[i].setter)(a));
	}

	archive_set_error(a, EINVAL, "No such filter");
	return (ARCHIVE_FATAL);
}